

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_pass(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADAPT pRVar4;
  REF_INTERP pRVar5;
  REF_NODE pRVar6;
  int *piVar7;
  REF_DBL RVar8;
  uint uVar9;
  REF_STATUS RVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  long lVar16;
  REF_NODE pRVar17;
  undefined8 uVar18;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar19;
  REF_INT cell;
  char *pcVar20;
  REF_INT RVar21;
  long lVar22;
  ulong uVar23;
  REF_GEOM pRVar24;
  bool bVar25;
  double dVar26;
  REF_BOOL allowed;
  double local_1d0;
  uint local_1c4;
  REF_NODE local_1c0;
  REF_NODE local_1b8;
  REF_BOOL allowed_1;
  REF_INTERP local_1a8;
  REF_GEOM local_1a0;
  REF_DBL tet_quality;
  REF_DBL max_ratio;
  REF_DBL normdev_orig;
  REF_INT node0;
  undefined4 uStack_17c;
  REF_DBL normdev;
  REF_INTERP local_170;
  REF_BOOL geom_edge;
  REF_INT node1;
  REF_DBL ideal [3];
  REF_DBL original [3];
  REF_DBL min_ratio;
  REF_BOOL geom_face;
  REF_BOOL geom_node;
  int local_dc;
  undefined1 local_d8 [16];
  REF_DBL quality;
  REF_DBL local_b0;
  REF_DBL total_force [3];
  
  if (ref_grid->surf == 0) {
    lVar22 = 0x28;
    if (ref_grid->twod == 0) {
      lVar22 = 0x50;
    }
  }
  else {
    lVar22 = 0x28;
  }
  ref_node = ref_grid->node;
  pRVar24 = ref_grid->geom;
  pRVar1 = *(REF_CELL *)((long)ref_grid->cell + lVar22 + -0x10);
  lVar22 = 0;
LAB_001e420d:
  if (lVar22 < pRVar24->max) {
    if (pRVar24->descr[lVar22 * 6] != 1) goto LAB_001e47ec;
    uVar12 = pRVar24->descr[lVar22 * 6 + 5];
    uVar9 = ref_geom_is_a(pRVar24,uVar12,0,&geom_node);
    if (uVar9 == 0) {
      if (geom_node != 0) goto LAB_001e47ec;
      ref_smooth_local_cell_about(pRVar1,ref_node,uVar12,&allowed);
      if (allowed == 0) {
        ref_node->age[(int)uVar12] = ref_node->age[(int)uVar12] + 1;
        goto LAB_001e47ec;
      }
      if (pRVar24->meshlink != (void *)0x0) {
        if (ref_grid->geom->meshlink == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x35f,"ref_smooth_meshlink_edge_improve","expect meshlink");
          uVar19 = 1;
        }
        else {
          local_1c0 = ref_grid->node;
          local_170 = ref_grid->interp;
          if ((-1 < (int)uVar12) &&
             (((pRVar2 = ref_grid->cell[0]->ref_adj, (int)uVar12 < pRVar2->nnode &&
               (pRVar2->first[uVar12] != -1)) ||
              ((pRVar2 = ref_grid->cell[6]->ref_adj, (int)uVar12 < pRVar2->nnode &&
               (pRVar2->first[uVar12] != -1)))))) goto LAB_001e47e4;
          uVar9 = ref_geom_is_a(ref_grid->geom,uVar12,1,(REF_BOOL *)&local_1c4);
          if (uVar9 == 0) {
            if (local_1c4 == 0) goto LAB_001e47e4;
            RVar10 = ref_smooth_edge_neighbors(ref_grid,uVar12,&node0,&node1);
            pRVar17 = local_1c0;
            if (RVar10 == 0) {
              if (node1 == -1) goto LAB_001e47e4;
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                total_force[lVar14] = 0.0;
              }
              local_1d0 = (double)CONCAT44(local_1d0._4_4_,node1);
              uVar9 = ref_smooth_add_pliant_force(local_1c0,uVar12,node0,total_force);
              if (uVar9 == 0) {
                uVar9 = ref_smooth_add_pliant_force(pRVar17,uVar12,local_1d0._0_4_,total_force);
                if (uVar9 == 0) {
                  dVar26 = ref_grid->adapt->smooth_pliant_alpha;
                  local_1a8 = (REF_INTERP)((long)(int)(uVar12 * 0xf) * 8);
                  pRVar3 = pRVar17->real;
                  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                    ideal[lVar14] =
                         total_force[lVar14] * dVar26 + (pRVar3 + (int)(uVar12 * 0xf))[lVar14];
                  }
                  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                    original[lVar14] = (pRVar3 + (int)(uVar12 * 0xf))[lVar14];
                  }
                  uVar9 = ref_smooth_tri_normdev_around(ref_grid,uVar12,&normdev_orig);
                  if (uVar9 == 0) {
                    iVar13 = -1;
                    if ((local_170 != (REF_INTERP)0x0) && (local_170->continuously != 0)) {
                      iVar13 = local_170->cell[(int)uVar12];
                    }
                    iVar11 = 0;
                    local_d8._0_8_ = normdev_orig;
                    dVar26 = 1.0;
                    uVar19 = 0;
                    local_1a0 = pRVar24;
LAB_001e44a7:
                    if (iVar11 == 8) goto LAB_001e476a;
                    local_1b8 = (REF_NODE)CONCAT44(local_1b8._4_4_,iVar11);
                    pRVar3 = pRVar17->real;
                    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                      *(double *)((long)pRVar3 + (long)local_1a8 + lVar14 * 8) =
                           ideal[lVar14] * dVar26 + original[lVar14] * (1.0 - dVar26);
                    }
                    local_1d0 = dVar26;
                    uVar9 = ref_geom_constrain(ref_grid,uVar12);
                    if (uVar9 == 0) {
                      uVar9 = ref_metric_interpolate_node(ref_grid,uVar12);
                      if ((uVar9 != 0) && (uVar9 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x387,"ref_smooth_meshlink_edge_improve",(ulong)uVar9,
                               "ref_metric_interpolate_node failed");
                        uVar19 = (ulong)uVar9;
                      }
                      if (uVar9 == 5) {
                        if (iVar13 != -1) {
                          local_170->cell[(int)uVar12] = iVar13;
                        }
LAB_001e4752:
                        dVar26 = local_1d0 * 0.5;
                        iVar11 = (int)local_1b8 + 1;
                        pRVar17 = local_1c0;
                        goto LAB_001e44a7;
                      }
                      if (uVar9 != 0) goto LAB_001e47f4;
                      uVar9 = ref_smooth_valid_no_geom_tri(ref_grid,uVar12,&allowed_1);
                      if (uVar9 == 0) {
                        if (allowed_1 == 0) goto LAB_001e4752;
                        uVar9 = ref_metric_interpolate_node(ref_grid,uVar12);
                        if (uVar9 == 0) {
                          uVar9 = ref_smooth_tri_quality_around(ref_grid,uVar12,&quality);
                          if (uVar9 == 0) {
                            uVar9 = ref_smooth_tri_ratio_around
                                              (ref_grid,uVar12,&min_ratio,&max_ratio);
                            if (uVar9 != 0) {
                              pcVar20 = "ratio";
                              uVar18 = 0x38e;
                              goto LAB_001e6111;
                            }
                            uVar9 = ref_smooth_tri_normdev_around(ref_grid,uVar12,&normdev);
                            if (uVar9 == 0) {
                              pRVar4 = ref_grid->adapt;
                              pRVar24 = local_1a0;
                              if ((((pRVar4->smooth_min_quality <= quality &&
                                     quality != pRVar4->smooth_min_quality) &&
                                   (pRVar4->post_min_ratio <= min_ratio)) &&
                                  (max_ratio <= pRVar4->post_max_ratio)) &&
                                 ((pRVar4->post_min_normdev <= normdev &&
                                   normdev != pRVar4->post_min_normdev ||
                                  ((double)local_d8._0_8_ < normdev)))) {
                                if (((int)uVar12 < 0) ||
                                   ((pRVar2 = ref_grid->cell[8]->ref_adj,
                                    pRVar2->nnode <= (int)uVar12 || (pRVar2->first[uVar12] == -1))))
                                goto LAB_001e47e4;
                                uVar9 = ref_smooth_tet_quality_around(ref_grid,uVar12,&tet_quality);
                                if (uVar9 == 0) {
                                  uVar9 = ref_smooth_tet_ratio_around
                                                    (ref_grid,uVar12,&min_ratio,&max_ratio);
                                  if (uVar9 != 0) {
                                    pcVar20 = "ratio";
                                    uVar18 = 0x39d;
                                    goto LAB_001e6111;
                                  }
                                  pRVar4 = ref_grid->adapt;
                                  pRVar24 = local_1a0;
                                  if (((tet_quality < pRVar4->smooth_min_quality ||
                                        tet_quality == pRVar4->smooth_min_quality) ||
                                      (min_ratio < pRVar4->post_min_ratio)) ||
                                     (pRVar4->post_max_ratio < max_ratio)) goto LAB_001e4752;
                                  goto LAB_001e47e4;
                                }
                                pcVar20 = "q";
                                uVar18 = 0x39a;
                                uVar19 = (ulong)uVar9;
                                goto LAB_001e6306;
                              }
                              goto LAB_001e4752;
                            }
                            pcVar20 = "nd";
                            uVar18 = 0x38f;
                          }
                          else {
                            pcVar20 = "q";
                            uVar18 = 0x38c;
                          }
                        }
                        else {
                          pcVar20 = "interp node";
                          uVar18 = 0x38b;
                        }
                      }
                      else {
                        pcVar20 = "normals";
                        uVar18 = 0x389;
                      }
                    }
                    else {
                      pcVar20 = "constrain";
                      uVar18 = 0x385;
                    }
LAB_001e6111:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,uVar18,"ref_smooth_meshlink_edge_improve",(ulong)uVar9,pcVar20);
                    uVar19 = (ulong)uVar9;
                    goto LAB_001e630d;
                  }
                  uVar19 = (ulong)uVar9;
                  pcVar20 = "nd_orig";
                  uVar18 = 0x378;
                }
                else {
                  uVar19 = (ulong)uVar9;
                  pcVar20 = "n1";
                  uVar18 = 0x36f;
                }
              }
              else {
                uVar19 = (ulong)uVar9;
                pcVar20 = "n0";
                uVar18 = 0x36e;
              }
            }
            else {
              pcVar20 = "edge nodes";
              uVar19 = 1;
              uVar18 = 0x36a;
            }
          }
          else {
            uVar19 = (ulong)uVar9;
            pcVar20 = "edge check";
            uVar18 = 0x367;
          }
LAB_001e6306:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 uVar18,"ref_smooth_meshlink_edge_improve",uVar19,pcVar20);
        }
        goto LAB_001e630d;
      }
      uVar9 = ref_smooth_geom_edge(ref_grid,uVar12);
      if (uVar9 == 0) goto LAB_001e47e4;
      uVar19 = (ulong)uVar9;
      pcVar20 = "ideal node for edge";
      uVar18 = 0x73b;
    }
    else {
      uVar19 = (ulong)uVar9;
      pcVar20 = "node check";
      uVar18 = 0x72f;
    }
    goto LAB_001e6674;
  }
  lVar22 = 0;
  for (uVar23 = 0; RVar21 = (REF_INT)uVar23, (long)uVar23 < (long)ref_node->max; uVar23 = uVar23 + 1
      ) {
    if (-1 < ref_node->global[uVar23]) {
      pRVar2 = ref_grid->cell[0]->ref_adj;
      if ((long)uVar23 < (long)pRVar2->nnode) {
        bVar25 = pRVar2->first[uVar23] != -1;
        allowed = (REF_BOOL)bVar25;
        if (bVar25) {
          uVar12 = ref_geom_is_a(pRVar24,RVar21,1,&geom_edge);
          if (uVar12 != 0) {
            uVar19 = (ulong)uVar12;
            pcVar20 = "edge check";
            uVar18 = 0x747;
            goto LAB_001e6674;
          }
          if (geom_edge == 0) {
            ref_smooth_local_cell_about(pRVar1,ref_node,RVar21,&allowed);
            if (allowed == 0) {
              piVar7 = ref_node->age + uVar23;
              *piVar7 = *piVar7 + 1;
            }
            else {
              ref_node->age[uVar23] = 0;
              pRVar2 = ref_grid->cell[0]->ref_adj;
              if (((long)uVar23 < (long)pRVar2->nnode) && (pRVar2->first[uVar23] != -1)) {
                pRVar17 = ref_grid->node;
                pRVar5 = ref_grid->interp;
                pRVar2 = ref_grid->cell[6]->ref_adj;
                if ((((((long)pRVar2->nnode <= (long)uVar23) || (pRVar2->first[uVar23] == -1)) &&
                     ((pRVar2 = ref_grid->cell[9]->ref_adj, (long)pRVar2->nnode <= (long)uVar23 ||
                      (pRVar2->first[uVar23] == -1)))) &&
                    ((pRVar2 = ref_grid->cell[10]->ref_adj, (long)pRVar2->nnode <= (long)uVar23 ||
                     (pRVar2->first[uVar23] == -1)))) &&
                   ((pRVar2 = ref_grid->cell[0xb]->ref_adj, (long)pRVar2->nnode <= (long)uVar23 ||
                    (pRVar2->first[uVar23] == -1)))) {
                  uVar12 = ref_geom_is_a(ref_grid->geom,RVar21,1,(REF_BOOL *)&local_1c4);
                  if (uVar12 != 0) {
                    uVar19 = (ulong)uVar12;
                    pcVar20 = "edge check";
                    uVar18 = 0x306;
                    goto LAB_001e6829;
                  }
                  if (local_1c4 != 0) goto LAB_001e4994;
                  RVar10 = ref_smooth_edge_neighbors(ref_grid,RVar21,&node0,&node1);
                  if (RVar10 != 0) {
                    pcVar20 = "edge nodes";
                    uVar19 = 1;
                    uVar18 = 0x309;
                    goto LAB_001e6829;
                  }
                  if (node1 == -1) goto LAB_001e4994;
                  pRVar6 = ref_grid->node;
                  allowed_1 = 1;
                  pRVar3 = pRVar6->real;
                  local_1d0 = (double)CONCAT44(local_1d0._4_4_,node0);
                  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                    total_force[lVar14] =
                         *(double *)((long)pRVar3 + lVar14 * 8 + lVar22) -
                         pRVar3[node0 * 0xf + lVar14];
                  }
                  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                    ideal[lVar14] =
                         pRVar3[node1 * 0xf + lVar14] -
                         *(double *)((long)pRVar3 + lVar14 * 8 + lVar22);
                  }
                  local_1b8 = (REF_NODE)CONCAT44(local_1b8._4_4_,node1);
                  local_1c0 = pRVar17;
                  uVar12 = ref_math_normalize(total_force);
                  if (uVar12 == 0) {
                    uVar12 = ref_math_normalize(ideal);
                    pRVar17 = local_1c0;
                    if (uVar12 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x2e2,"ref_smooth_node_same_tangent",(ulong)uVar12,
                             "edge 1 zero length");
                      printf("nodes %d %d %d\n",(ulong)local_1d0 & 0xffffffff,uVar23 & 0xffffffff,
                             (ulong)local_1b8 & 0xffffffff);
                      goto LAB_001e6808;
                    }
                    if (total_force[2] * ideal[2] +
                        total_force[0] * ideal[0] + total_force[1] * ideal[1] <
                        pRVar6->same_normal_tol) goto LAB_001e4994;
                    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                      original[lVar14] = 0.0;
                    }
                    uVar12 = ref_smooth_add_pliant_force(local_1c0,RVar21,local_1d0._0_4_,original);
                    if (uVar12 != 0) {
                      uVar19 = (ulong)uVar12;
                      pcVar20 = "n0";
                      uVar18 = 0x310;
                      goto LAB_001e6829;
                    }
                    uVar12 = ref_smooth_add_pliant_force(pRVar17,RVar21,(int)local_1b8,original);
                    if (uVar12 != 0) {
                      uVar19 = (ulong)uVar12;
                      pcVar20 = "n1";
                      uVar18 = 0x311;
                      goto LAB_001e6829;
                    }
                    dVar26 = ref_grid->adapt->smooth_pliant_alpha;
                    pRVar3 = pRVar17->real;
                    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                      (&quality)[lVar14] =
                           original[lVar14] * dVar26 +
                           *(double *)((long)pRVar3 + lVar14 * 8 + lVar22);
                    }
                    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                      (&min_ratio)[lVar14] = *(REF_DBL *)((long)pRVar3 + lVar14 * 8 + lVar22);
                    }
                    local_1a8 = (REF_INTERP)CONCAT44(local_1a8._4_4_,0xffffffff);
                    if ((pRVar5 != (REF_INTERP)0x0) &&
                       (local_1a8 = (REF_INTERP)CONCAT44(local_1a8._4_4_,0xffffffff),
                       pRVar5->continuously != 0)) {
                      local_1a8 = (REF_INTERP)CONCAT44(local_1a8._4_4_,pRVar5->cell[uVar23]);
                    }
                    dVar26 = 1.0;
                    uVar19 = 0;
                    iVar13 = 0;
                    local_1a0 = pRVar24;
                    while (iVar13 != 8) {
                      local_1b8 = (REF_NODE)CONCAT44(local_1b8._4_4_,iVar13);
                      pRVar3 = pRVar17->real;
                      for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                        *(double *)((long)pRVar3 + lVar14 * 8 + lVar22) =
                             (&quality)[lVar14] * dVar26 + (&min_ratio)[lVar14] * (1.0 - dVar26);
                      }
                      local_1d0 = dVar26;
                      uVar12 = ref_metric_interpolate_node(ref_grid,RVar21);
                      if ((uVar12 != 0) && (uVar12 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x327,"ref_smooth_no_geom_edge_improve",(ulong)uVar12,
                               "ref_metric_interpolate_node failed");
                        uVar19 = (ulong)uVar12;
                      }
                      if (uVar12 != 5) {
                        if (uVar12 != 0) goto LAB_001e4e82;
                        uVar12 = ref_smooth_valid_no_geom_tri(ref_grid,RVar21,&allowed_1);
                        if (uVar12 == 0) {
                          if (allowed_1 == 0) goto LAB_001e4df8;
                          uVar12 = ref_metric_interpolate_node(ref_grid,RVar21);
                          if (uVar12 == 0) {
                            uVar12 = ref_smooth_tri_quality_around(ref_grid,RVar21,&max_ratio);
                            if (uVar12 == 0) {
                              uVar12 = ref_smooth_tri_ratio_around
                                                 (ref_grid,RVar21,&tet_quality,&normdev);
                              if (uVar12 == 0) {
                                pRVar4 = ref_grid->adapt;
                                pRVar24 = local_1a0;
                                if (((max_ratio < pRVar4->smooth_min_quality ||
                                      max_ratio == pRVar4->smooth_min_quality) ||
                                    (tet_quality < pRVar4->post_min_ratio)) ||
                                   (pRVar4->post_max_ratio < normdev)) goto LAB_001e4df8;
                                pRVar2 = ref_grid->cell[8]->ref_adj;
                                if (((long)pRVar2->nnode <= (long)uVar23) ||
                                   (pRVar2->first[uVar23] == -1)) goto LAB_001e4994;
                                uVar12 = ref_smooth_tet_quality_around
                                                   (ref_grid,RVar21,&normdev_orig);
                                if (uVar12 == 0) {
                                  uVar12 = ref_smooth_tet_ratio_around
                                                     (ref_grid,RVar21,&tet_quality,&normdev);
                                  if (uVar12 == 0) {
                                    pRVar4 = ref_grid->adapt;
                                    pRVar24 = local_1a0;
                                    if (((normdev_orig < pRVar4->smooth_min_quality ||
                                          normdev_orig == pRVar4->smooth_min_quality) ||
                                        (tet_quality < pRVar4->post_min_ratio)) ||
                                       (pRVar4->post_max_ratio < normdev)) goto LAB_001e4df8;
                                    goto LAB_001e4994;
                                  }
                                  pcVar20 = "ratio";
                                  uVar18 = 0x339;
                                }
                                else {
                                  pcVar20 = "q";
                                  uVar18 = 0x336;
                                }
                              }
                              else {
                                pcVar20 = "ratio";
                                uVar18 = 0x32e;
                              }
                            }
                            else {
                              pcVar20 = "q";
                              uVar18 = 0x32c;
                            }
                          }
                          else {
                            pcVar20 = "interp node";
                            uVar18 = 0x32b;
                          }
                        }
                        else {
                          pcVar20 = "normals";
                          uVar18 = 0x329;
                        }
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,uVar18,"ref_smooth_no_geom_edge_improve",(ulong)uVar12,pcVar20);
                        uVar19 = (ulong)uVar12;
                        goto LAB_001e6833;
                      }
                      if ((int)local_1a8 != -1) {
                        pRVar5->cell[uVar23] = (int)local_1a8;
                      }
LAB_001e4df8:
                      dVar26 = local_1d0 * 0.5;
                      pRVar17 = local_1c0;
                      iVar13 = (int)local_1b8 + 1;
                    }
                    pRVar3 = pRVar17->real;
                    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                      *(REF_DBL *)((long)pRVar3 + lVar14 * 8 + lVar22) = (&min_ratio)[lVar14];
                    }
                    uVar12 = ref_metric_interpolate_node(ref_grid,RVar21);
                    if ((uVar12 != 0) && (uVar12 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                             ,0x34b,"ref_smooth_no_geom_edge_improve",(ulong)uVar12,"interp");
                      uVar19 = (ulong)uVar12;
                    }
                    if ((uVar12 == 5) || (uVar12 == 0)) goto LAB_001e4994;
LAB_001e4e82:
                    if ((int)uVar19 == 0) goto LAB_001e4994;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x2e0,"ref_smooth_node_same_tangent",(ulong)uVar12,"edge 0 zero length")
                    ;
LAB_001e6808:
                    uVar19 = (ulong)uVar12;
                    pcVar20 = "tan";
                    uVar18 = 0x30c;
LAB_001e6829:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,uVar18,"ref_smooth_no_geom_edge_improve",uVar19,pcVar20);
                  }
LAB_001e6833:
                  pcVar20 = "improve";
                  uVar18 = 0x752;
                  goto LAB_001e6674;
                }
              }
            }
          }
        }
      }
      else {
        allowed = 0;
      }
    }
LAB_001e4994:
    lVar22 = lVar22 + 0x78;
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov edge");
  }
  for (lVar22 = 0; lVar22 < pRVar24->max; lVar22 = lVar22 + 1) {
    if (pRVar24->descr[lVar22 * 6] == 2) {
      uVar12 = pRVar24->descr[lVar22 * 6 + 5];
      uVar9 = ref_geom_is_a(pRVar24,uVar12,1,&geom_edge);
      if (uVar9 != 0) {
        uVar19 = (ulong)uVar9;
        pcVar20 = "edge check";
        uVar18 = 0x75e;
        goto LAB_001e6674;
      }
      if (geom_edge == 0) {
        ref_smooth_local_cell_about(pRVar1,ref_node,uVar12,&allowed);
        if (allowed == 0) {
          ref_node->age[(int)uVar12] = ref_node->age[(int)uVar12] + 1;
        }
        else {
          if (pRVar24->meshlink != (void *)0x0) {
            if (ref_grid->geom->meshlink == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x478,"ref_smooth_meshlink_face_improve","expect meshlink");
              uVar19 = 1;
            }
            else {
              local_1b8 = ref_grid->node;
              local_1a8 = ref_grid->interp;
              if ((-1 < (int)uVar12) &&
                 (((pRVar2 = ref_grid->cell[6]->ref_adj, (int)uVar12 < pRVar2->nnode &&
                   (pRVar2->first[uVar12] != -1)) ||
                  ((pRVar2 = ref_grid->cell[0]->ref_adj, (int)uVar12 < pRVar2->nnode &&
                   (pRVar2->first[uVar12] != -1)))))) goto LAB_001e54b7;
              uVar9 = ref_cell_id_list_around(ref_grid->cell[3],uVar12,2,&node1,&node0);
              uVar19 = (ulong)uVar9;
              if ((uVar9 == 0) || (uVar9 == 7)) {
                if (1 < node1) goto LAB_001e54b7;
                uVar9 = ref_geom_is_a(ref_grid->geom,uVar12,2,(REF_BOOL *)&local_1c4);
                if (uVar9 == 0) {
                  if (local_1c4 == 0) goto LAB_001e54b7;
                  local_170 = (REF_INTERP)((long)(int)(uVar12 * 0xf) * 8);
                  pRVar3 = local_1b8->real;
                  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                    ideal[lVar14] = (pRVar3 + (int)(uVar12 * 0xf))[lVar14];
                  }
                  iVar13 = -1;
                  if ((local_1a8 != (REF_INTERP)0x0) && (local_1a8->continuously != 0)) {
                    iVar13 = local_1a8->cell[(int)uVar12];
                  }
                  local_1a0 = pRVar24;
                  uVar9 = ref_smooth_tri_quality_around(ref_grid,uVar12,original);
                  if (uVar9 == 0) {
                    uVar9 = ref_smooth_tri_normdev_around(ref_grid,uVar12,&normdev_orig);
                    if (uVar9 == 0) {
                      uVar9 = ref_smooth_tri_ratio_around(ref_grid,uVar12,&max_ratio,&tet_quality);
                      if (uVar9 == 0) {
                        local_d8._0_8_ = original[0];
                        if (((original[0] < 0.5) || (max_ratio < 0.5)) || (2.0 < tet_quality)) {
                          uVar9 = ref_smooth_tri_weighted_ideal(ref_grid,uVar12,total_force);
                          if (uVar9 == 0) goto LAB_001e517b;
                          pcVar20 = "ideal";
                          uVar18 = 0x498;
                        }
                        else {
                          uVar9 = ref_smooth_tri_pliant(ref_grid,uVar12,total_force);
                          if (uVar9 == 0) {
LAB_001e517b:
                            local_b0 = normdev_orig;
                            dVar26 = 1.0;
                            iVar11 = 0;
                            pRVar24 = local_1a0;
                            while (iVar11 != 8) {
                              local_1c0 = (REF_NODE)CONCAT44(local_1c0._4_4_,iVar11);
                              pRVar3 = local_1b8->real;
                              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                                *(double *)((long)pRVar3 + (long)local_170 + lVar14 * 8) =
                                     total_force[lVar14] * dVar26 + ideal[lVar14] * (1.0 - dVar26);
                              }
                              local_1d0 = dVar26;
                              uVar9 = ref_geom_constrain(ref_grid,uVar12);
                              if (uVar9 != 0) {
                                pcVar20 = "constrain";
                                uVar18 = 0x4a2;
                                goto LAB_001e6647;
                              }
                              uVar9 = ref_metric_interpolate_node(ref_grid,uVar12);
                              if ((uVar9 != 0) && (uVar9 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x4a4,"ref_smooth_meshlink_face_improve",(ulong)uVar9,
                                       "ref_metric_interpolate_node failed");
                                uVar19 = (ulong)uVar9;
                              }
                              if (uVar9 == 5) {
                                if (iVar13 != -1) {
                                  local_1a8->cell[(int)uVar12] = iVar13;
                                }
                              }
                              else {
                                if (uVar9 != 0) goto LAB_001e54cc;
                                uVar9 = ref_smooth_valid_no_geom_tri(ref_grid,uVar12,&allowed_1);
                                if (uVar9 != 0) {
                                  pcVar20 = "twod tri";
                                  uVar18 = 0x4a6;
                                  goto LAB_001e6647;
                                }
                                uVar9 = ref_smooth_tri_quality_around(ref_grid,uVar12,&quality);
                                if (uVar9 != 0) {
                                  pcVar20 = "q";
                                  uVar18 = 0x4a7;
                                  goto LAB_001e6647;
                                }
                                uVar9 = ref_smooth_tri_normdev_around(ref_grid,uVar12,&normdev);
                                if (uVar9 != 0) {
                                  pcVar20 = "nd";
                                  uVar18 = 0x4a8;
                                  goto LAB_001e6647;
                                }
                                uVar9 = ref_smooth_tri_ratio_around
                                                  (ref_grid,uVar12,&max_ratio,&tet_quality);
                                if (uVar9 != 0) {
                                  pcVar20 = "ratio";
                                  uVar18 = 0x4aa;
                                  goto LAB_001e6647;
                                }
                                pRVar24 = local_1a0;
                                if ((((allowed_1 != 0) && ((double)local_d8._0_8_ < quality)) &&
                                    ((pRVar4 = ref_grid->adapt, pRVar4->post_min_ratio <= max_ratio
                                     && (tet_quality <= pRVar4->post_max_ratio)))) &&
                                   ((pRVar4->post_min_normdev <= normdev &&
                                     normdev != pRVar4->post_min_normdev || (local_b0 < normdev))))
                                {
                                  if (((int)uVar12 < 0) ||
                                     ((pRVar2 = ref_grid->cell[8]->ref_adj,
                                      pRVar2->nnode <= (int)uVar12 || (pRVar2->first[uVar12] == -1))
                                     )) goto LAB_001e54b7;
                                  uVar9 = ref_smooth_tet_quality_around(ref_grid,uVar12,&min_ratio);
                                  if (uVar9 != 0) {
                                    pcVar20 = "q";
                                    uVar18 = 0x4b3;
                                    uVar19 = (ulong)uVar9;
                                    goto LAB_001e6357;
                                  }
                                  uVar9 = ref_smooth_tet_ratio_around
                                                    (ref_grid,uVar12,&max_ratio,&tet_quality);
                                  if (uVar9 != 0) {
                                    pcVar20 = "ratio";
                                    uVar18 = 0x4b6;
                                    goto LAB_001e6647;
                                  }
                                  pRVar4 = ref_grid->adapt;
                                  pRVar24 = local_1a0;
                                  if (((pRVar4->smooth_min_quality <= min_ratio &&
                                        min_ratio != pRVar4->smooth_min_quality) &&
                                      (pRVar4->post_min_ratio <= max_ratio)) &&
                                     (tet_quality <= pRVar4->post_max_ratio)) goto LAB_001e54b7;
                                }
                              }
                              dVar26 = local_1d0 * 0.5;
                              iVar11 = (int)local_1c0 + 1;
                            }
                            pRVar3 = local_1b8->real;
                            for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                              *(REF_DBL *)((long)pRVar3 + (long)(&local_170->ref_mpi + lVar14)) =
                                   ideal[lVar14];
                            }
                            uVar9 = ref_metric_interpolate_node(ref_grid,uVar12);
                            if ((uVar9 != 0) && (uVar9 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x4c7,"ref_smooth_meshlink_face_improve",(ulong)uVar9,"interp"
                                    );
                              uVar19 = (ulong)uVar9;
                            }
                            if ((uVar9 != 0) && (uVar9 != 5)) {
LAB_001e54cc:
                              if ((int)uVar19 != 0) goto LAB_001e6653;
                            }
                            goto LAB_001e54b7;
                          }
                          pcVar20 = "ideal";
                          uVar18 = 0x49a;
                        }
                      }
                      else {
                        pcVar20 = "ratio";
                        uVar18 = 0x495;
                      }
                    }
                    else {
                      pcVar20 = "nd_orig";
                      uVar18 = 0x493;
                    }
                  }
                  else {
                    pcVar20 = "q";
                    uVar18 = 0x492;
                  }
                }
                else {
                  pcVar20 = "face check";
                  uVar18 = 0x486;
                }
LAB_001e6647:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar18,"ref_smooth_meshlink_face_improve",(ulong)uVar9,pcVar20);
                uVar19 = (ulong)uVar9;
              }
              else {
                pcVar20 = "count faceids";
                uVar18 = 0x481;
LAB_001e6357:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar18,"ref_smooth_meshlink_face_improve",(ulong)uVar9,pcVar20);
              }
            }
LAB_001e6653:
            pcVar20 = "improve";
            uVar18 = 0x768;
            goto LAB_001e6674;
          }
          uVar9 = ref_smooth_geom_face(ref_grid,uVar12);
          if (uVar9 != 0) {
            uVar19 = (ulong)uVar9;
            pcVar20 = "ideal node for face";
            uVar18 = 0x76a;
            goto LAB_001e6674;
          }
LAB_001e54b7:
          ref_node->age[(int)uVar12] = 0;
        }
      }
    }
  }
  lVar22 = 0;
  for (lVar14 = 0; lVar14 < ref_node->max; lVar14 = lVar14 + 1) {
    if ((-1 < ref_node->global[lVar14]) &&
       ((pRVar2 = ref_grid->cell[0]->ref_adj, pRVar2->nnode <= lVar14 ||
        (bVar25 = pRVar2->first[lVar14] == -1, allowed = (REF_BOOL)bVar25, bVar25)))) {
      pRVar2 = ref_grid->cell[3]->ref_adj;
      if (lVar14 < pRVar2->nnode) {
        bVar25 = pRVar2->first[lVar14] != -1;
        allowed = (REF_BOOL)bVar25;
        if (bVar25) {
          RVar21 = (REF_INT)lVar14;
          uVar12 = ref_geom_is_a(pRVar24,RVar21,2,&geom_face);
          if (uVar12 != 0) {
            uVar19 = (ulong)uVar12;
            pcVar20 = "face check";
            uVar18 = 0x77a;
            goto LAB_001e6674;
          }
          if (geom_face == 0) {
            ref_smooth_local_cell_about(pRVar1,ref_node,RVar21,&allowed);
            if (allowed == 0) {
              ref_node->age[lVar14] = ref_node->age[lVar14] + 1;
            }
            else {
              pRVar5 = ref_grid->interp;
              pRVar2 = ref_grid->cell[6]->ref_adj;
              if (((((pRVar2->nnode <= lVar14) || (pRVar2->first[lVar14] == -1)) &&
                   ((pRVar2 = ref_grid->cell[9]->ref_adj, pRVar2->nnode <= lVar14 ||
                    (pRVar2->first[lVar14] == -1)))) &&
                  (((pRVar2 = ref_grid->cell[10]->ref_adj, pRVar2->nnode <= lVar14 ||
                    (pRVar2->first[lVar14] == -1)) &&
                   ((pRVar2 = ref_grid->cell[0xb]->ref_adj, pRVar2->nnode <= lVar14 ||
                    (pRVar2->first[lVar14] == -1)))))) &&
                 ((pRVar2 = ref_grid->cell[0]->ref_adj, pRVar2->nnode <= lVar14 ||
                  (pRVar2->first[lVar14] == -1)))) {
                local_1c0 = ref_grid->node;
                uVar12 = ref_cell_id_list_around(ref_grid->cell[3],RVar21,2,&allowed_1,&node1);
                uVar19 = (ulong)uVar12;
                if ((uVar12 == 0) || (uVar12 == 7)) {
                  if (1 < allowed_1) goto LAB_001e56f3;
                  local_170 = pRVar5;
                  uVar12 = ref_geom_is_a(ref_grid->geom,RVar21,2,&local_dc);
                  if (uVar12 == 0) {
                    if (local_dc != 0) goto LAB_001e56f3;
                    local_1a8 = (REF_INTERP)ref_grid->cell[3];
                    piVar7 = *(int **)&local_1a8->walk_steps;
                    cell = -1;
                    pRVar17 = (REF_NODE)0xffffffff;
                    if (lVar14 < *piVar7) {
                      uVar12 = *(uint *)(*(long *)(piVar7 + 2) + lVar14 * 4);
                      pRVar17 = (REF_NODE)0xffffffff;
                      if ((long)(int)uVar12 != -1) {
                        cell = *(REF_INT *)(*(long *)(piVar7 + 4) + (long)(int)uVar12 * 8 + 4);
                        pRVar17 = (REF_NODE)(ulong)uVar12;
                      }
                    }
                    pRVar6 = ref_grid->node;
                    uVar18 = 0;
                    while ((int)pRVar17 != -1) {
                      local_1d0 = (double)CONCAT44(local_1d0._4_4_,(int)uVar18);
                      local_1b8 = pRVar17;
                      uVar12 = ref_cell_nodes((REF_CELL)local_1a8,cell,(REF_INT *)total_force);
                      if (uVar12 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x3e2,"ref_smooth_node_same_normal",(ulong)uVar12,"nodes");
LAB_001e66e9:
                        uVar19 = (ulong)uVar12;
                        pcVar20 = "normal dev";
                        uVar18 = 0x41d;
                        goto LAB_001e670a;
                      }
                      uVar12 = ref_node_tri_normal(pRVar6,(REF_INT *)total_force,ideal);
                      if (uVar12 != 0) {
                        pcVar20 = "orig normal";
                        uVar18 = 0x3e3;
LAB_001e66dd:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,uVar18,"ref_smooth_node_same_normal",(ulong)uVar12,pcVar20);
                        goto LAB_001e66e9;
                      }
                      if (((ulong)local_1d0 & 1) == 0) {
                        original[0] = ideal[0];
                        original[1] = ideal[1];
                        original[2] = ideal[2];
                        uVar12 = ref_math_normalize(original);
                        if (uVar12 != 0) {
                          pcVar20 = "original triangle has zero area";
                          uVar18 = 0x3e9;
                          goto LAB_001e66dd;
                        }
                      }
                      uVar12 = ref_math_normalize(ideal);
                      if (uVar12 != 0) {
                        if (uVar12 != 4) {
                          pcVar20 = "new normal length";
                          uVar18 = 0x3f0;
                          goto LAB_001e66dd;
                        }
                        goto LAB_001e56f3;
                      }
                      if (original[2] * ideal[2] + original[0] * ideal[0] + original[1] * ideal[1] <
                          pRVar6->same_normal_tol) goto LAB_001e56f3;
                      lVar16 = *(long *)(*(long *)&local_1a8->walk_steps + 0x10);
                      pRVar17 = (REF_NODE)(long)*(int *)(lVar16 + (long)(int)local_1b8 * 8);
                      uVar18 = CONCAT71((int7)(int3)((ulong)local_1b8 >> 8),1);
                      cell = -1;
                      if (pRVar17 != (REF_NODE)0xffffffffffffffff) {
                        cell = *(REF_INT *)(lVar16 + 4 + (long)pRVar17 * 8);
                      }
                    }
                    pRVar3 = local_1c0->real;
                    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                      (&min_ratio)[lVar16] = *(REF_DBL *)((long)pRVar3 + lVar16 * 8 + lVar22);
                    }
                    local_1b8 = (REF_NODE)CONCAT44(local_1b8._4_4_,0xffffffff);
                    if ((local_170 != (REF_INTERP)0x0) &&
                       (local_1b8 = (REF_NODE)CONCAT44(local_1b8._4_4_,0xffffffff),
                       local_170->continuously != 0)) {
                      local_1b8 = (REF_NODE)CONCAT44(local_1b8._4_4_,local_170->cell[lVar14]);
                    }
                    uVar12 = ref_smooth_tri_quality_around(ref_grid,RVar21,&max_ratio);
                    if (uVar12 == 0) {
                      uVar12 = ref_smooth_tri_ratio_around
                                         (ref_grid,RVar21,&normdev_orig,(REF_DBL *)&node0);
                      RVar8 = max_ratio;
                      if (uVar12 == 0) {
                        bVar15 = ((double)CONCAT44(uStack_17c,node0) <= 2.0 &&
                                 (double)CONCAT44(uStack_17c,node0) != 2.0) &
                                 -(0.5 < normdev_orig) & -(0.5 < max_ratio);
                        local_1a8 = (REF_INTERP)CONCAT71(local_1a8._1_7_,bVar15);
                        if (bVar15 == 1) {
                          uVar12 = ref_smooth_tri_pliant(ref_grid,RVar21,&quality);
                          if (uVar12 == 0) {
LAB_001e5988:
                            local_d8._8_8_ = 0;
                            local_d8._0_8_ = RVar8 * 0.9;
                            dVar26 = 1.0;
                            iVar13 = 0;
                            local_1a0 = pRVar24;
                            while (iVar13 != 8) {
                              local_1d0 = (double)CONCAT44(local_1d0._4_4_,iVar13);
                              pRVar3 = local_1c0->real;
                              for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                                *(double *)((long)pRVar3 + lVar16 * 8 + lVar22) =
                                     (&quality)[lVar16] * dVar26 +
                                     (&min_ratio)[lVar16] * (1.0 - dVar26);
                              }
                              uVar12 = ref_metric_interpolate_node(ref_grid,RVar21);
                              if ((uVar12 != 0) && (uVar12 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x43a,"ref_smooth_no_geom_tri_improve",(ulong)uVar12,
                                       "ref_metric_interpolate_node failed");
                                uVar19 = (ulong)uVar12;
                              }
                              if (uVar12 == 5) {
                                if ((int)local_1b8 != -1) {
                                  local_170->cell[lVar14] = (int)local_1b8;
                                }
                                goto LAB_001e5c38;
                              }
                              if (uVar12 != 0) goto LAB_001e5cc2;
                              uVar12 = ref_smooth_tri_quality_around(ref_grid,RVar21,&tet_quality);
                              if (uVar12 != 0) {
                                pcVar20 = "q";
                                uVar18 = 0x43c;
                                goto LAB_001e6613;
                              }
                              uVar12 = ref_smooth_tri_ratio_around
                                                 (ref_grid,RVar21,&normdev_orig,(REF_DBL *)&node0);
                              if (uVar12 != 0) {
                                pcVar20 = "ratio";
                                uVar18 = 0x43e;
                                goto LAB_001e6613;
                              }
                              uVar12 = ref_smooth_valid_no_geom_tri
                                                 (ref_grid,RVar21,(REF_BOOL *)&local_1c4);
                              if (uVar12 != 0) {
                                pcVar20 = "twod tri";
                                uVar18 = 0x440;
                                goto LAB_001e6613;
                              }
                              if ((local_1c4 == 0) ||
                                 (normdev_orig < ref_grid->adapt->post_min_ratio)) {
                                bVar25 = false;
                              }
                              else {
                                bVar25 = (double)CONCAT44(uStack_17c,node0) <=
                                         ref_grid->adapt->post_max_ratio;
                              }
                              pRVar24 = local_1a0;
                              if ((char)local_1a8 == '\0') {
                                bVar15 = bVar25 & RVar8 < tet_quality;
                                local_1c4 = (uint)bVar15;
                                if (bVar15 != 0) goto LAB_001e5b96;
                              }
                              else {
                                bVar15 = bVar25 & -((double)local_d8._0_8_ < tet_quality) &
                                                  -(0.4 < tet_quality);
                                local_1c4 = (uint)bVar15;
                                if (bVar15 == 1) {
LAB_001e5b96:
                                  pRVar2 = ref_grid->cell[8]->ref_adj;
                                  if ((pRVar2->nnode <= lVar14) || (pRVar2->first[lVar14] == -1))
                                  goto LAB_001e56f3;
                                  uVar12 = ref_smooth_tet_quality_around(ref_grid,RVar21,&normdev);
                                  if (uVar12 != 0) {
                                    pcVar20 = "q";
                                    uVar18 = 0x451;
                                    goto LAB_001e6613;
                                  }
                                  uVar12 = ref_smooth_tet_ratio_around
                                                     (ref_grid,RVar21,&normdev_orig,
                                                      (REF_DBL *)&node0);
                                  if (uVar12 != 0) {
                                    pcVar20 = "ratio";
                                    uVar18 = 0x454;
                                    goto LAB_001e6613;
                                  }
                                  pRVar4 = ref_grid->adapt;
                                  pRVar24 = local_1a0;
                                  if (((pRVar4->smooth_min_quality <= normdev &&
                                        normdev != pRVar4->smooth_min_quality) &&
                                      (pRVar4->post_min_ratio <= normdev_orig)) &&
                                     ((double)CONCAT44(uStack_17c,node0) <= pRVar4->post_max_ratio))
                                  goto LAB_001e56f3;
                                }
                              }
LAB_001e5c38:
                              dVar26 = dVar26 * 0.5;
                              iVar13 = local_1d0._0_4_ + 1;
                            }
                            pRVar3 = local_1c0->real;
                            for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                              *(REF_DBL *)((long)pRVar3 + lVar16 * 8 + lVar22) =
                                   (&min_ratio)[lVar16];
                            }
                            uVar12 = ref_metric_interpolate_node(ref_grid,RVar21);
                            if ((uVar12 != 0) && (uVar12 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x465,"ref_smooth_no_geom_tri_improve",(ulong)uVar12,"interp")
                              ;
                              uVar19 = (ulong)uVar12;
                            }
                            if ((uVar12 != 5) && (uVar12 != 0)) {
LAB_001e5cc2:
                              if ((int)uVar19 != 0) goto LAB_001e6714;
                            }
                            goto LAB_001e56f3;
                          }
                          pcVar20 = "ideal";
                          uVar18 = 0x42f;
                        }
                        else {
                          uVar12 = ref_smooth_tri_weighted_ideal(ref_grid,RVar21,&quality);
                          if (uVar12 == 0) goto LAB_001e5988;
                          pcVar20 = "ideal";
                          uVar18 = 0x431;
                        }
                      }
                      else {
                        pcVar20 = "ratio";
                        uVar18 = 0x42b;
                      }
                    }
                    else {
                      pcVar20 = "q";
                      uVar18 = 0x429;
                    }
                  }
                  else {
                    pcVar20 = "face check";
                    uVar18 = 0x41a;
                  }
LAB_001e6613:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,uVar18,"ref_smooth_no_geom_tri_improve",(ulong)uVar12,pcVar20);
                  uVar19 = (ulong)uVar12;
                }
                else {
                  pcVar20 = "count faceids";
                  uVar18 = 0x415;
LAB_001e670a:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,uVar18,"ref_smooth_no_geom_tri_improve",uVar19,pcVar20);
                }
LAB_001e6714:
                pcVar20 = "no geom smooth";
                uVar18 = 0x783;
                goto LAB_001e6674;
              }
            }
          }
        }
      }
      else {
        allowed = 0;
      }
    }
LAB_001e56f3:
    lVar22 = lVar22 + 0x78;
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov face");
  }
  pRVar1 = ref_grid->cell[8];
  for (lVar22 = 0; lVar22 < ref_node->max; lVar22 = lVar22 + 1) {
    if (-1 < ref_node->global[lVar22]) {
      ref_smooth_local_cell_about(pRVar1,ref_node,(REF_INT)lVar22,&allowed);
      if (allowed == 0) {
        ref_node->age[lVar22] = ref_node->age[lVar22] + 1;
      }
      else {
        pRVar2 = ref_grid->cell[3]->ref_adj;
        if ((((pRVar2->nnode <= lVar22) || (pRVar2->first[lVar22] == -1)) &&
            ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= lVar22 ||
             (pRVar2->first[lVar22] == -1)))) &&
           ((pRVar2 = ref_grid->cell[8]->ref_adj, lVar22 < pRVar2->nnode &&
            (pRVar2->first[lVar22] != -1)))) {
          uVar12 = ref_smooth_tet_improve(ref_grid,(REF_INT)lVar22);
          if (uVar12 != 0) {
            uVar19 = (ulong)uVar12;
            pcVar20 = "ideal tet node";
            uVar18 = 0x79a;
            goto LAB_001e6674;
          }
          ref_node->age[lVar22] = 0;
        }
      }
    }
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov int");
  }
  if (ref_grid->surf == 0) {
    pRVar1 = ref_grid->cell[8];
    for (iVar13 = 0; iVar13 < pRVar1->max; iVar13 = iVar13 + 1) {
      RVar10 = ref_cell_nodes(pRVar1,iVar13,(REF_INT *)total_force);
      if (RVar10 == 0) {
        uVar12 = ref_node_tet_quality(ref_node,(REF_INT *)total_force,ideal);
        if (uVar12 != 0) {
          uVar19 = (ulong)uVar12;
          pcVar20 = "qual";
          uVar18 = 0x7ab;
LAB_001e6674:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 uVar18,"ref_smooth_pass",uVar19,pcVar20);
          return (REF_STATUS)uVar19;
        }
        if (ideal[0] < 0.1) {
          for (lVar22 = 0; lVar22 < pRVar1->node_per; lVar22 = lVar22 + 1) {
            uVar12 = *(uint *)((long)total_force + lVar22 * 4);
            ref_smooth_local_cell_about(pRVar1,ref_node,uVar12,&allowed);
            if (allowed == 0) {
              ref_node->age[(int)uVar12] = ref_node->age[(int)uVar12] + 1;
            }
            else if (((int)uVar12 < 0) ||
                    (((pRVar2 = ref_grid->cell[3]->ref_adj, pRVar2->nnode <= (int)uVar12 ||
                      (pRVar2->first[uVar12] == -1)) &&
                     ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= (int)uVar12 ||
                      (pRVar2->first[uVar12] == -1)))))) {
              uVar9 = ref_smooth_tet_improve(ref_grid,uVar12);
              if (uVar9 != 0) {
                uVar19 = (ulong)uVar9;
                pcVar20 = "ideal";
                uVar18 = 0x7b9;
                goto LAB_001e6674;
              }
              ref_node->age[(int)uVar12] = 0;
            }
          }
        }
      }
    }
  }
  return 0;
LAB_001e476a:
  pRVar3 = pRVar17->real;
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    *(REF_DBL *)((long)pRVar3 + (long)(&local_1a8->ref_mpi + lVar14)) = original[lVar14];
  }
  uVar9 = ref_metric_interpolate_node(ref_grid,uVar12);
  if ((uVar9 != 0) && (uVar9 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x3af,
           "ref_smooth_meshlink_edge_improve",(ulong)uVar9,"interp");
    uVar19 = (ulong)uVar9;
  }
  if ((uVar9 != 0) && (uVar9 != 5)) {
LAB_001e47f4:
    if ((int)uVar19 != 0) {
LAB_001e630d:
      pcVar20 = "improve";
      uVar18 = 0x739;
      goto LAB_001e6674;
    }
  }
LAB_001e47e4:
  ref_node->age[(int)uVar12] = 0;
LAB_001e47ec:
  lVar22 = lVar22 + 1;
  goto LAB_001e420d;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_pass(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node;
  REF_BOOL allowed, geom_node, geom_edge, geom_face, interior;
  REF_BOOL vol_val = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol start");

  /* smooth edges first if we have geom */
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
    if (geom_node) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_edge_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_edge(ref_grid, node), "ideal node for edge");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol geom edge");

  /* smooth edges first without geom, for 2D */
  each_ref_node_valid_node(ref_node, node) {
    /* boundaries only */
    allowed = !ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    ref_node_age(ref_node, node) = 0;
    RSS(ref_smooth_no_geom_edge_improve(ref_grid, node), "improve");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol nogeom edge");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov edge");

  /* smooth faces if we have geom, but skip edges */
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_face_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_face(ref_grid, node), "ideal node for face");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face geom");

  /* smooth faces without geom */
  each_ref_node_valid_node(ref_node, node) {
    /* avoid edges */
    allowed = ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    /* need tri to smooth */
    allowed = !ref_cell_node_empty(ref_grid_tri(ref_grid), node);
    if (!allowed) continue;
    /* avoid geometry faces (or edges) */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
    if (geom_face) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    RSS(ref_smooth_no_geom_tri_improve(ref_grid, node), "no geom smooth");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face nogeom");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov face");

  /* smooth interior */
  ref_cell = ref_grid_tet(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
               ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
               !ref_cell_node_empty(ref_grid_tet(ref_grid), node);
    if (interior) {
      RSS(ref_smooth_tet_improve(ref_grid, node), "ideal tet node");
      ref_node_age(ref_node, node) = 0;
    }
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol int");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov int");

  /* smooth low quality tets */
  ref_cell = ref_grid_tet(ref_grid);

  if (!ref_grid_surf(ref_grid)) {
    REF_DBL quality, min_quality = 0.10;
    REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          node = nodes[cell_node];
          RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
              "para");
          if (!allowed) {
            ref_node_age(ref_node, node)++;
            continue;
          }

          interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                     ref_cell_node_empty(ref_grid_qua(ref_grid), node);
          if (interior) {
            RSS(ref_smooth_tet_improve(ref_grid, node), "ideal");
            ref_node_age(ref_node, node) = 0;
          }
        }
      }
    }
    if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol about");
  }
  return REF_SUCCESS;
}